

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

bool __thiscall Game::teamMembers(Game *this,size_t player1,size_t player2)

{
  bool bVar1;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  bVar1 = true;
  if (player1 != player2) {
    getTeamMember((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_30,this,player1);
    bVar1 = contains<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_30,player2);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_30);
  }
  return bVar1;
}

Assistant:

bool Game::teamMembers(size_t player1, size_t player2) {
    return player1 == player2 || contains(getTeamMember(player1), player2);
}